

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetNavFocusScope(ImGuiID focus_scope_id)

{
  ImGuiID IVar1;
  ImGuiID IVar2;
  ImGuiFocusScopeData *__src;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiFocusScopeData *pIVar5;
  ImGuiFocusScopeData *pIVar6;
  ImGuiFocusScopeData IVar7;
  int iVar8;
  int iVar9;
  ImGuiFocusScopeData IVar10;
  long lVar11;
  ulong uVar12;
  ImGuiWindow *pIVar13;
  
  pIVar3 = GImGui;
  GImGui->NavFocusScopeId = focus_scope_id;
  iVar9 = (pIVar3->NavFocusRoute).Capacity;
  if (iVar9 < 0) {
    iVar9 = 0;
    pIVar5 = (ImGuiFocusScopeData *)MemAlloc(0);
    pIVar6 = (pIVar3->NavFocusRoute).Data;
    if (pIVar6 != (ImGuiFocusScopeData *)0x0) {
      memcpy(pIVar5,pIVar6,(long)(pIVar3->NavFocusRoute).Size << 3);
      MemFree((pIVar3->NavFocusRoute).Data);
    }
    (pIVar3->NavFocusRoute).Data = pIVar5;
    (pIVar3->NavFocusRoute).Capacity = 0;
  }
  (pIVar3->NavFocusRoute).Size = 0;
  if (focus_scope_id != 0) {
    if (pIVar3->CurrentFocusScopeId == focus_scope_id) {
      lVar11 = (long)(pIVar3->FocusScopeStack).Size;
      if (lVar11 < 1) {
        iVar9 = 0;
      }
      else {
        uVar12 = lVar11 + 1;
        iVar9 = 0;
        do {
          pIVar6 = (pIVar3->FocusScopeStack).Data;
          if (pIVar6[uVar12 - 2].WindowID != pIVar3->CurrentWindow->ID) break;
          if (iVar9 == (pIVar3->NavFocusRoute).Capacity) {
            if (iVar9 == 0) {
              iVar4 = 8;
            }
            else {
              iVar4 = iVar9 / 2 + iVar9;
            }
            iVar8 = iVar9 + 1;
            if (iVar9 + 1 < iVar4) {
              iVar8 = iVar4;
            }
            pIVar5 = (ImGuiFocusScopeData *)MemAlloc((long)iVar8 << 3);
            __src = (pIVar3->NavFocusRoute).Data;
            if (__src != (ImGuiFocusScopeData *)0x0) {
              memcpy(pIVar5,__src,(long)(pIVar3->NavFocusRoute).Size << 3);
              MemFree((pIVar3->NavFocusRoute).Data);
            }
            (pIVar3->NavFocusRoute).Data = pIVar5;
            (pIVar3->NavFocusRoute).Capacity = iVar8;
            iVar9 = (pIVar3->NavFocusRoute).Size;
          }
          else {
            pIVar5 = (pIVar3->NavFocusRoute).Data;
          }
          pIVar5[iVar9] = pIVar6[uVar12 - 2];
          iVar9 = (pIVar3->NavFocusRoute).Size + 1;
          (pIVar3->NavFocusRoute).Size = iVar9;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
    }
    else {
      if (pIVar3->NavWindow->NavRootFocusScopeId != focus_scope_id) {
        return;
      }
      IVar1 = pIVar3->NavWindow->ID;
      if (iVar9 == 0) {
        pIVar6 = (ImGuiFocusScopeData *)MemAlloc(0x40);
        pIVar5 = (pIVar3->NavFocusRoute).Data;
        if (pIVar5 != (ImGuiFocusScopeData *)0x0) {
          memcpy(pIVar6,pIVar5,(long)(pIVar3->NavFocusRoute).Size << 3);
          MemFree((pIVar3->NavFocusRoute).Data);
        }
        (pIVar3->NavFocusRoute).Data = pIVar6;
        (pIVar3->NavFocusRoute).Capacity = 8;
        lVar11 = (long)(pIVar3->NavFocusRoute).Size;
      }
      else {
        pIVar6 = (pIVar3->NavFocusRoute).Data;
        lVar11 = 0;
      }
      IVar7.WindowID = IVar1;
      IVar7.ID = focus_scope_id;
      pIVar6[lVar11] = IVar7;
      iVar9 = (pIVar3->NavFocusRoute).Size + 1;
      (pIVar3->NavFocusRoute).Size = iVar9;
    }
    for (pIVar13 = pIVar3->NavWindow->ParentWindowForFocusRoute; pIVar13 != (ImGuiWindow *)0x0;
        pIVar13 = pIVar13->ParentWindowForFocusRoute) {
      IVar1 = pIVar13->NavRootFocusScopeId;
      IVar2 = pIVar13->ID;
      if (iVar9 == (pIVar3->NavFocusRoute).Capacity) {
        if (iVar9 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar9 / 2 + iVar9;
        }
        iVar8 = iVar9 + 1;
        if (iVar9 + 1 < iVar4) {
          iVar8 = iVar4;
        }
        pIVar6 = (ImGuiFocusScopeData *)MemAlloc((long)iVar8 << 3);
        pIVar5 = (pIVar3->NavFocusRoute).Data;
        if (pIVar5 != (ImGuiFocusScopeData *)0x0) {
          memcpy(pIVar6,pIVar5,(long)(pIVar3->NavFocusRoute).Size << 3);
          MemFree((pIVar3->NavFocusRoute).Data);
        }
        (pIVar3->NavFocusRoute).Data = pIVar6;
        (pIVar3->NavFocusRoute).Capacity = iVar8;
        iVar9 = (pIVar3->NavFocusRoute).Size;
      }
      else {
        pIVar6 = (pIVar3->NavFocusRoute).Data;
      }
      IVar10.WindowID = IVar2;
      IVar10.ID = IVar1;
      pIVar6[iVar9] = IVar10;
      iVar9 = (pIVar3->NavFocusRoute).Size + 1;
      (pIVar3->NavFocusRoute).Size = iVar9;
    }
  }
  return;
}

Assistant:

void ImGui::SetNavFocusScope(ImGuiID focus_scope_id)
{
    ImGuiContext& g = *GImGui;
    g.NavFocusScopeId = focus_scope_id;
    g.NavFocusRoute.resize(0); // Invalidate
    if (focus_scope_id == 0)
        return;
    IM_ASSERT(g.NavWindow != NULL);

    // Store current path (in reverse order)
    if (focus_scope_id == g.CurrentFocusScopeId)
    {
        // Top of focus stack contains local focus scopes inside current window
        for (int n = g.FocusScopeStack.Size - 1; n >= 0 && g.FocusScopeStack.Data[n].WindowID == g.CurrentWindow->ID; n--)
            g.NavFocusRoute.push_back(g.FocusScopeStack.Data[n]);
    }
    else if (focus_scope_id == g.NavWindow->NavRootFocusScopeId)
        g.NavFocusRoute.push_back({ focus_scope_id, g.NavWindow->ID });
    else
        return;

    // Then follow on manually set ParentWindowForFocusRoute field (#6798)
    for (ImGuiWindow* window = g.NavWindow->ParentWindowForFocusRoute; window != NULL; window = window->ParentWindowForFocusRoute)
        g.NavFocusRoute.push_back({ window->NavRootFocusScopeId, window->ID });
    IM_ASSERT(g.NavFocusRoute.Size < 100); // Maximum depth is technically 251 as per CalcRoutingScore(): 254 - 3
}